

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<unsigned_long_long>::removeAt(QList<unsigned_long_long> *this,qsizetype i)

{
  char *in_RSI;
  QList<unsigned_long_long> *in_RDI;
  
  remove(in_RDI,in_RSI);
  return;
}

Assistant:

void removeAt(qsizetype i) { remove(i); }